

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# per_thread_sem.cc
# Opt level: O0

void absl::synchronization_internal::PerThreadSem::Init(ThreadIdentity *identity)

{
  Waiter *this;
  ThreadIdentity *identity_local;
  memory_order __b_1;
  memory_order __b;
  
  this = Waiter::GetWaiter(identity);
  Waiter::Waiter(this);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (identity->ticker).super___atomic_base<int>._M_i = 0;
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (identity->wait_start).super___atomic_base<int>._M_i = 0;
  std::atomic<bool>::store(&identity->is_idle,false,memory_order_relaxed);
  return;
}

Assistant:

void PerThreadSem::Init(base_internal::ThreadIdentity *identity) {
  new (Waiter::GetWaiter(identity)) Waiter();
  identity->ticker.store(0, std::memory_order_relaxed);
  identity->wait_start.store(0, std::memory_order_relaxed);
  identity->is_idle.store(false, std::memory_order_relaxed);
}